

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O3

void mk_vhost_init(char *path,mk_server *server)

{
  mk_list *pmVar1;
  int iVar2;
  mk_vhost *pmVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  char *__s;
  char *sites;
  char *file;
  char *buf;
  unsigned_long len;
  file_info f_info;
  char *local_70;
  char *local_68;
  char *local_60;
  unsigned_long local_58;
  file_info local_50;
  
  local_60 = (char *)0x0;
  local_70 = (char *)0x0;
  if (server->conf_sites == (char *)0x0) {
    mk_print(0x1002,"[vhost] skipping default site");
    return;
  }
  mk_string_build(&local_70,&local_58,"%s/%s/",path);
  iVar2 = mk_file_get_info(local_70,&local_50,1);
  if ((iVar2 == -1) || (local_50.is_directory == '\0')) {
    free(local_70);
    local_70 = server->conf_sites;
  }
  mk_string_build(&local_60,&local_58,"%s/default");
  pmVar3 = mk_vhost_read(local_60);
  if (pmVar3 == (mk_vhost *)0x0) {
    mk_print(0x1001,"Error parsing main configuration file \'default\'");
  }
  pmVar1 = (server->hosts).prev;
  (server->hosts).prev = &pmVar3->_head;
  (pmVar3->_head).next = &server->hosts;
  (pmVar3->_head).prev = pmVar1;
  pmVar1->next = &pmVar3->_head;
  server->nhosts = server->nhosts + 1;
  free(local_60);
  local_60 = (char *)0x0;
  __dirp = opendir(local_70);
  if (__dirp != (DIR *)0x0) {
    pdVar4 = readdir(__dirp);
    if (pdVar4 != (dirent *)0x0) {
      do {
        if (pdVar4->d_name[0] != '.') {
          __s = pdVar4->d_name;
          sVar5 = strlen(__s);
          if (__s[sVar5 - 1] != '~') {
            iVar2 = strcasecmp(__s,"default");
            if (iVar2 != 0) {
              local_68 = (char *)0x0;
              mk_string_build(&local_68,&local_58,"%s/%s",local_70,__s);
              pmVar3 = mk_vhost_read(local_68);
              free(local_68);
              if (pmVar3 != (mk_vhost *)0x0) {
                pmVar1 = (server->hosts).prev;
                (server->hosts).prev = &pmVar3->_head;
                (pmVar3->_head).next = &server->hosts;
                (pmVar3->_head).prev = pmVar1;
                pmVar1->next = &pmVar3->_head;
                server->nhosts = server->nhosts + 1;
              }
            }
          }
        }
        pdVar4 = readdir(__dirp);
      } while (pdVar4 != (dirent *)0x0);
    }
    closedir(__dirp);
    free(local_70);
    return;
  }
  mk_mem_free(local_70);
  mk_print(0x1001,"Could not open %s",local_70);
  exit(1);
}

Assistant:

void mk_vhost_init(char *path, struct mk_server *server)
{
    DIR *dir;
    unsigned long len;
    char *buf = 0;
    char *sites = 0;
    char *file;
    struct mk_vhost *p_host;     /* debug */
    struct dirent *ent;
    struct file_info f_info;
    int ret;

    if (!server->conf_sites) {
        mk_warn("[vhost] skipping default site");
        return;
    }

    /* Read default virtual host file */
    mk_string_build(&sites, &len, "%s/%s/",
                    path, server->conf_sites);
    ret = mk_file_get_info(sites, &f_info, MK_FILE_EXISTS);
    if (ret == -1 || f_info.is_directory == MK_FALSE) {
        mk_mem_free(sites);
        sites = server->conf_sites;
    }

    mk_string_build(&buf, &len, "%s/default", sites);

    p_host = mk_vhost_read(buf);
    if (!p_host) {
        mk_err("Error parsing main configuration file 'default'");
    }
    mk_list_add(&p_host->_head, &server->hosts);
    server->nhosts++;
    mk_mem_free(buf);
    buf = NULL;


    /* Read all virtual hosts defined in sites/ */
    if (!(dir = opendir(sites))) {
        mk_mem_free(sites);
        mk_err("Could not open %s", sites);
        exit(EXIT_FAILURE);
    }

    /* Reading content */
    while ((ent = readdir(dir)) != NULL) {
        if (ent->d_name[0] == '.') {
            continue;
        }
        if (strcmp((char *) ent->d_name, "..") == 0) {
            continue;
        }
        if (ent->d_name[strlen(ent->d_name) - 1] ==  '~') {
            continue;
        }
        if (strcasecmp((char *) ent->d_name, "default") == 0) {
            continue;
        }
        file = NULL;
        mk_string_build(&file, &len, "%s/%s", sites, ent->d_name);

        p_host = mk_vhost_read(file);
        mk_mem_free(file);
        if (!p_host) {
            continue;
        }
        else {
            mk_list_add(&p_host->_head, &server->hosts);
            server->nhosts++;
        }
    }
    closedir(dir);
    mk_mem_free(sites);
}